

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O2

bool __thiscall
CppJieba::MPSegment::_calcDAG
          (MPSegment *this,const_iterator begin,const_iterator end,SegmentContext *segContext)

{
  pointer pSVar1;
  mapped_type pTVar2;
  bool bVar3;
  const_iterator begin_00;
  mapped_type *ppTVar4;
  iterator iVar5;
  DagType *this_00;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
  vp;
  uint nextp;
  undefined1 local_78 [24];
  size_type sStack_60;
  float local_58;
  size_t local_50;
  __node_base_ptr p_Stack_48;
  TrieNodeInfo *local_40;
  double dStack_38;
  
  if (begin._M_current < end._M_current) {
    vp.
    super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vp.
    super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vp.
    super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (begin_00._M_current = begin._M_current; begin_00._M_current != end._M_current;
        begin_00._M_current = begin_00._M_current + 1) {
      nextp = CONCAT22(nextp._2_2_,*begin_00._M_current);
      local_78._0_8_ = &p_Stack_48;
      local_78._8_8_ = 1;
      local_78._16_8_ = (_Hash_node_base *)0x0;
      sStack_60 = 0;
      local_58 = 1.0;
      local_40 = (TrieNodeInfo *)0x0;
      dStack_38 = 0.0;
      local_50 = 0;
      p_Stack_48 = (__node_base_ptr)0x0;
      std::vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>::
      emplace_back<CppJieba::SegmentChar>(segContext,(SegmentChar *)&nextp);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_78);
      if (vp.
          super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          vp.
          super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        vp.
        super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             vp.
             super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      pSVar1 = (segContext->
               super__Vector_base<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      bVar3 = Trie::find(&this->_trie,begin_00,end,&vp);
      uVar8 = (uint)((ulong)((long)begin_00._M_current - (long)begin._M_current) >> 1);
      if (bVar3) {
        uVar6 = 0;
        while( true ) {
          uVar7 = (ulong)uVar6;
          if ((ulong)((long)vp.
                            super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)vp.
                            super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar7) break;
          nextp = vp.
                  super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar7].first + uVar8;
          pTVar2 = vp.
                   super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar7].second;
          ppTVar4 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&pSVar1[-1].dag,(key_type *)&nextp);
          *ppTVar4 = pTVar2;
          uVar6 = uVar6 + 1;
        }
      }
      this_00 = &pSVar1[-1].dag;
      nextp = uVar8;
      iVar5 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,(key_type_conflict *)&nextp);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        nextp = uVar8;
        ppTVar4 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_00,(key_type *)&nextp);
        *ppTVar4 = (mapped_type)0x0;
      }
    }
    std::
    _Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
    ::~_Vector_base(&vp.
                     super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                   );
  }
  else {
    std::__cxx11::string::string((string *)&nextp,"begin >= end.",(allocator *)&vp);
    Limonp::Logger::LoggingF(3,"MPSegment.hpp",0x92,(string *)&nextp);
    std::__cxx11::string::~string((string *)&nextp);
  }
  return begin._M_current < end._M_current;
}

Assistant:

bool _calcDAG(Unicode::const_iterator begin, Unicode::const_iterator end, SegmentContext& segContext) const
            {
                if(begin >= end)
                {
                    LogError("begin >= end.");
                    return false;
                }

                vector<pair<uint, const TrieNodeInfo*> > vp;
                for(Unicode::const_iterator it = begin; it != end; it++)
                {
                    segContext.push_back(SegmentChar(*it));
                    SegmentChar& back = segContext.back();
                    int i = it - begin;
                    vp.clear();
                    if(_trie.find(it, end, vp))
                    {
                        for(uint j = 0; j < vp.size(); j++)
                        {
                            uint nextp = vp[j].first + i;
                            back.dag[nextp] = vp[j].second; 
                        }
                    }
                    if(back.dag.end() == back.dag.find(i))
                    {
                        back.dag[i] = NULL;
                    }
                }
                return true;
            }